

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.cpp
# Opt level: O1

UInt32 * crnlib::Hc_GetMatchesSpec
                   (UInt32 lenLimit,UInt32 curMatch,UInt32 pos,Byte *cur,CLzRef *son,
                   UInt32 _cyclicBufferPos,UInt32 _cyclicBufferSize,UInt32 cutValue,
                   UInt32 *distances,UInt32 maxLen)

{
  UInt32 *pUVar1;
  UInt32 *pUVar2;
  UInt32 UVar3;
  ulong uVar4;
  ulong uVar5;
  Byte *pBVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  bool bVar11;
  UInt32 *local_40;
  
  local_40 = distances;
  son[(long)(ulong)_cyclicBufferPos] = curMatch;
  pUVar1 = (UInt32 *)(ulong)_cyclicBufferPos;
  do {
    bVar11 = false;
    bVar10 = cutValue != 0;
    cutValue = cutValue - 1;
    pUVar2 = local_40;
    if ((bVar10) && (uVar9 = pos - curMatch, uVar9 < _cyclicBufferSize)) {
      pBVar6 = cur + -(ulong)uVar9;
      UVar3 = 0;
      if (_cyclicBufferPos < uVar9) {
        UVar3 = _cyclicBufferSize;
      }
      curMatch = son[(_cyclicBufferPos - uVar9) + UVar3];
      pUVar2 = pUVar1;
      if ((pBVar6[maxLen] == cur[maxLen]) && (*pBVar6 == *cur)) {
        uVar4 = 1;
        uVar7 = 0;
        do {
          uVar8 = (uint)uVar4;
          UVar3 = lenLimit;
          if (uVar4 - (lenLimit - 1) == 1) break;
          uVar5 = uVar4 & 0xffffffff;
          uVar4 = uVar4 + 1;
          uVar7 = uVar7 + 1;
          uVar8 = uVar7;
          UVar3 = uVar7;
        } while (pBVar6[uVar5] == cur[uVar5]);
        bVar11 = uVar8 != lenLimit;
        if (maxLen < UVar3) {
          *local_40 = UVar3;
          local_40[1] = uVar9 - 1;
          local_40 = local_40 + 2;
          maxLen = UVar3;
          if (uVar8 == lenLimit) {
            pUVar2 = local_40;
          }
        }
        else {
          bVar11 = true;
        }
      }
      else {
        bVar11 = true;
      }
    }
    pUVar1 = pUVar2;
    if (!bVar11) {
      return pUVar2;
    }
  } while( true );
}

Assistant:

static UInt32* Hc_GetMatchesSpec(UInt32 lenLimit, UInt32 curMatch, UInt32 pos, const Byte* cur, CLzRef* son,
                                 UInt32 _cyclicBufferPos, UInt32 _cyclicBufferSize, UInt32 cutValue,
                                 UInt32* distances, UInt32 maxLen) {
  son[_cyclicBufferPos] = curMatch;
  for (;;) {
    UInt32 delta = pos - curMatch;
    if (cutValue-- == 0 || delta >= _cyclicBufferSize)
      return distances;
    {
      const Byte* pb = cur - delta;
      curMatch = son[_cyclicBufferPos - delta + ((delta > _cyclicBufferPos) ? _cyclicBufferSize : 0)];
      if (pb[maxLen] == cur[maxLen] && *pb == *cur) {
        UInt32 len = 0;
        while (++len != lenLimit)
          if (pb[len] != cur[len])
            break;
        if (maxLen < len) {
          *distances++ = maxLen = len;
          *distances++ = delta - 1;
          if (len == lenLimit)
            return distances;
        }
      }
    }
  }
}